

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseLast
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  byte bVar1;
  Descriptor *pDVar2;
  bool bVar3;
  uint32_t uVar4;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  MessageLite *pMVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar6;
  char *description;
  Metadata MVar7;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
LAB_00f5d86d:
    pDVar2 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar2,MVar7.descriptor,field,"UnsafeArenaReleaseLast");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ != pDVar2) {
    description = "Field does not match message type.";
LAB_00f5d8ab:
    anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"UnsafeArenaReleaseLast",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    UnsafeArenaReleaseLast();
    goto LAB_00f5d86d;
  }
  if ((bVar1 & 0x20) == 0) {
    description = "Field is singular; the method requires a repeated field.";
    goto LAB_00f5d8ab;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (pDVar2,field,"UnsafeArenaReleaseLast",CPPTYPE_MESSAGE);
  }
  if ((bVar1 & 8) != 0) {
    uVar4 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar5 = protobuf::internal::ExtensionSet::UnsafeArenaReleaseLast
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                        field->number_);
    return (Message *)pMVar5;
  }
  if (field->type_ == 0xb) {
    bVar3 = FieldDescriptor::is_map_message_type(field);
    if (bVar3) {
      VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
      this_00 = (MapFieldBase *)MutableRawImpl(this,message,field);
      this_01 = protobuf::internal::MapFieldBase::MutableRepeatedField(this_00);
      goto LAB_00f5d849;
    }
  }
  VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
  this_01 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
LAB_00f5d849:
  pVVar6 = protobuf::internal::RepeatedPtrFieldBase::
           UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     (this_01);
  return pVVar6;
}

Assistant:

Message* Reflection::UnsafeArenaReleaseLast(
    Message* message, const FieldDescriptor* field) const {
  USAGE_MUTABLE_CHECK_ALL(UnsafeArenaReleaseLast, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseLast(field->number()));
  } else {
    if (IsMapFieldInApi(field)) {
      return MutableRaw<MapFieldBase>(message, field)
          ->MutableRepeatedField()
          ->UnsafeArenaReleaseLast<GenericTypeHandler<Message>>();
    } else {
      return MutableRaw<RepeatedPtrFieldBase>(message, field)
          ->UnsafeArenaReleaseLast<GenericTypeHandler<Message>>();
    }
  }
}